

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O2

bool duckdb::EnumToVarcharCast<unsigned_char>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  data_ptr_t pdVar1;
  byte *pbVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  Vector *pVVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  data_ptr_t pdVar13;
  ulong uVar14;
  data_ptr_t pdVar15;
  idx_t iVar16;
  UnifiedVectorFormat local_78;
  
  pVVar8 = EnumType::GetValuesInsertOrder(&source->type);
  pdVar1 = pVVar8->data;
  if (source->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar15 = result->data;
    pdVar4 = source->data;
    FlatVector::VerifyFlatVector(source);
    FlatVector::VerifyFlatVector(result);
    if ((source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pdVar15 = pdVar15 + 8;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        uVar6 = *(undefined8 *)(pdVar1 + (ulong)pdVar4[iVar16] * 0x10 + 8);
        *(undefined8 *)(pdVar15 + -8) = *(undefined8 *)(pdVar1 + (ulong)pdVar4[iVar16] * 0x10);
        *(undefined8 *)pdVar15 = uVar6;
        pdVar15 = pdVar15 + 0x10;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 &(source->validity).super_TemplatedValidityMask<unsigned_long>);
      puVar3 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar11 = 0;
      for (uVar10 = 0; uVar10 != count + 0x3f >> 6; uVar10 = uVar10 + 1) {
        if (puVar3 == (unsigned_long *)0x0) {
          uVar12 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar12 = count;
          }
LAB_013b5e4b:
          pdVar13 = pdVar15 + uVar11 * 0x10 + 8;
          for (; uVar7 = uVar11, uVar11 < uVar12; uVar11 = uVar11 + 1) {
            uVar6 = *(undefined8 *)(pdVar1 + (ulong)pdVar4[uVar11] * 0x10 + 8);
            *(undefined8 *)(pdVar13 + -8) = *(undefined8 *)(pdVar1 + (ulong)pdVar4[uVar11] * 0x10);
            *(undefined8 *)pdVar13 = uVar6;
            pdVar13 = pdVar13 + 0x10;
          }
        }
        else {
          uVar5 = puVar3[uVar10];
          uVar12 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar12 = count;
          }
          if (uVar5 == 0xffffffffffffffff) goto LAB_013b5e4b;
          uVar7 = uVar12;
          if (uVar5 != 0) {
            pdVar13 = pdVar15 + uVar11 * 0x10 + 8;
            uVar14 = 0;
            for (; uVar7 = uVar11, uVar11 < uVar12; uVar11 = uVar11 + 1) {
              if ((uVar5 >> (uVar14 & 0x3f) & 1) != 0) {
                uVar6 = *(undefined8 *)(pdVar1 + (ulong)pdVar4[uVar11] * 0x10 + 8);
                *(undefined8 *)(pdVar13 + -8) =
                     *(undefined8 *)(pdVar1 + (ulong)pdVar4[uVar11] * 0x10);
                *(undefined8 *)pdVar13 = uVar6;
              }
              pdVar13 = pdVar13 + 0x10;
              uVar14 = uVar14 + 1;
            }
          }
        }
        uVar11 = uVar7;
      }
    }
  }
  else if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar15 = result->data;
    pbVar2 = source->data;
    puVar3 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      uVar6 = *(undefined8 *)(pdVar1 + (ulong)*pbVar2 * 0x10 + 8);
      *(undefined8 *)pdVar15 = *(undefined8 *)(pdVar1 + (ulong)*pbVar2 * 0x10);
      *(undefined8 *)(pdVar15 + 8) = uVar6;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(source,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar15 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pdVar15 = pdVar15 + 8;
      for (uVar10 = 0; count != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = uVar10;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar11 = (ulong)(local_78.sel)->sel_vector[uVar10];
        }
        uVar6 = *(undefined8 *)(pdVar1 + (ulong)local_78.data[uVar11] * 0x10 + 8);
        *(undefined8 *)(pdVar15 + -8) =
             *(undefined8 *)(pdVar1 + (ulong)local_78.data[uVar11] * 0x10);
        *(undefined8 *)pdVar15 = uVar6;
        pdVar15 = pdVar15 + 0x10;
      }
    }
    else {
      pdVar15 = pdVar15 + 8;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar9 = iVar16;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar9 = (idx_t)(local_78.sel)->sel_vector[iVar16];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar9 >> 6]
             >> (iVar9 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
        }
        else {
          uVar6 = *(undefined8 *)(pdVar1 + (ulong)local_78.data[iVar9] * 0x10 + 8);
          *(undefined8 *)(pdVar15 + -8) =
               *(undefined8 *)(pdVar1 + (ulong)local_78.data[iVar9] * 0x10);
          *(undefined8 *)pdVar15 = uVar6;
        }
        pdVar15 = pdVar15 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return true;
}

Assistant:

static bool EnumToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &enum_dictionary = EnumType::GetValuesInsertOrder(source.GetType());
	auto dictionary_data = FlatVector::GetData<string_t>(enum_dictionary);

	UnaryExecutor::Execute<SRC, string_t>(source, result, count,
	                                      [&](SRC enum_idx) { return dictionary_data[enum_idx]; });
	return true;
}